

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

acttab * acttab_alloc(void)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  acttab *paVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  undefined4 extraout_EDX;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint *__ptr;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  
  lVar15 = 1;
  iVar7 = 0x30;
  paVar9 = (acttab *)calloc(1,0x30);
  if (paVar9 != (acttab *)0x0) {
    return paVar9;
  }
  acttab_alloc_cold_1();
  iVar6 = *(int *)(lVar15 + 0x24);
  iVar3 = *(int *)(lVar15 + 0x28);
  if (iVar3 <= iVar6) {
    *(int *)(lVar15 + 0x28) = iVar3 + 0x19;
    __ptr = *(uint **)(lVar15 + 0x10);
    pvVar10 = realloc(__ptr,(long)iVar3 * 8 + 200);
    *(void **)(lVar15 + 0x10) = pvVar10;
    if (pvVar10 == (void *)0x0) {
      acttab_action_cold_1();
      if ((int)__ptr[9] < 1) {
        __assert_fail("p->nLookahead>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                      ,0x229,"int acttab_insert(acttab *)");
      }
      uVar8 = *__ptr;
      uVar21 = __ptr[1];
      iVar7 = __ptr[8] + uVar8 + 1;
      if ((int)uVar21 <= iVar7) {
        uVar8 = iVar7 + uVar21 + 0x14;
        __ptr[1] = uVar8;
        pvVar10 = *(void **)(__ptr + 2);
        pvVar11 = realloc(pvVar10,(long)(int)uVar8 << 3);
        *(void **)(__ptr + 2) = pvVar11;
        if (pvVar11 == (void *)0x0) {
          acttab_insert_cold_1();
          lVar15 = *(long *)((long)pvVar10 + 8);
          do {
            if (lVar15 == 0) {
              return (acttab *)0x0;
            }
            if ((*(long *)(lVar15 + 0x50) == 0) && (0 < (long)*(int *)(lVar15 + 0x18))) {
              lVar13 = 0;
              lVar20 = 0;
              do {
                if (lVar20 != 0) break;
                lVar20 = *(long *)(*(long *)(lVar15 + 0x20) + lVar13 * 8);
                if (*(int *)(lVar20 + 0xc) == 2) {
                  piVar1 = (int *)(lVar20 + 0x54);
                  if (0 < (long)*piVar1) {
                    plVar2 = (long *)(lVar20 + 0x58);
                    lVar17 = 0;
                    do {
                      lVar20 = *(long *)(*plVar2 + lVar17 * 8);
                      if (-1 < *(int *)(lVar20 + 0x20)) goto LAB_00103e53;
                      lVar17 = lVar17 + 1;
                    } while (*piVar1 != lVar17);
                  }
LAB_00103e59:
                  lVar20 = 0;
                }
                else {
                  if (*(int *)(lVar20 + 0x20) < 0) goto LAB_00103e59;
LAB_00103e53:
                  *(long *)(lVar15 + 0x50) = lVar20;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != *(int *)(lVar15 + 0x18));
            }
            lVar15 = *(long *)(lVar15 + 0x70);
          } while( true );
        }
        uVar14 = __ptr[1];
        if ((int)uVar21 < (int)uVar14) {
          memset((void *)((long)pvVar11 + (long)(int)uVar21 * 8),0xff,
                 (ulong)(~uVar21 + uVar14) * 8 + 8);
        }
        uVar8 = *__ptr;
        uVar21 = uVar14;
      }
      if (0 < (int)uVar8) {
        lVar15 = *(long *)(__ptr + 2);
        uVar14 = __ptr[6];
        iVar7 = uVar14 - uVar8;
        uVar16 = (ulong)uVar8;
        uVar12 = (ulong)(uVar8 - 1);
        do {
          iVar7 = iVar7 + 1;
          if ((*(uint *)(lVar15 + uVar12 * 8) == uVar14) &&
             (*(uint *)(lVar15 + 4 + uVar12 * 8) == __ptr[7])) {
            uVar4 = __ptr[9];
            if (0 < (long)(int)uVar4) {
              lVar20 = 0;
              do {
                iVar6 = *(int *)(*(long *)(__ptr + 4) + lVar20 * 8);
                uVar19 = (iVar6 - uVar14) + (int)uVar12;
                if (((uVar8 <= uVar19) || (iVar6 != *(int *)(lVar15 + (ulong)uVar19 * 8))) ||
                   (*(int *)(*(long *)(__ptr + 4) + 4 + lVar20 * 8) !=
                    *(int *)(lVar15 + 4 + (ulong)uVar19 * 8))) goto LAB_00103cd6;
                lVar20 = lVar20 + 1;
              } while ((int)uVar4 != lVar20);
            }
            uVar18 = 0;
            uVar19 = 0;
            do {
              iVar6 = *(int *)(lVar15 + uVar18 * 8);
              uVar19 = uVar19 + (iVar7 + (int)uVar18 == iVar6 && -1 < iVar6);
              uVar18 = uVar18 + 1;
            } while (uVar8 != uVar18);
            if (uVar19 == uVar4) {
              if (0 < (int)uVar16) goto LAB_00103d7e;
              break;
            }
          }
LAB_00103cd6:
          uVar16 = uVar12 & 0xffffffff;
          bVar5 = 0 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar5);
      }
      uVar14 = uVar21 - __ptr[8];
      if (uVar14 == 0 || (int)uVar21 < (int)__ptr[8]) {
        uVar12 = 0;
      }
      else {
        lVar15 = *(long *)(__ptr + 2);
        iVar7 = 0;
        uVar12 = 0;
        do {
          if (*(int *)(lVar15 + uVar12 * 8) < 0) {
            if (0 < (long)(int)__ptr[9]) {
              lVar20 = 0;
              do {
                uVar21 = (*(int *)(*(long *)(__ptr + 4) + lVar20 * 8) - __ptr[6]) + (int)uVar12;
                if (((int)uVar21 < 0) || (-1 < *(int *)(lVar15 + (ulong)uVar21 * 8)))
                goto LAB_00103d02;
                lVar20 = lVar20 + 1;
              } while ((int)__ptr[9] != lVar20);
            }
            if ((int)uVar8 < 1) {
              uVar16 = 0;
            }
            else {
              uVar16 = 0;
              while (__ptr[6] + iVar7 + (int)uVar16 != *(int *)(lVar15 + uVar16 * 8)) {
                uVar16 = uVar16 + 1;
                if (uVar8 == uVar16) goto LAB_00103d7e;
              }
            }
            if ((uint)uVar16 == uVar8) goto LAB_00103d7e;
          }
LAB_00103d02:
          uVar12 = uVar12 + 1;
          iVar7 = iVar7 + -1;
        } while (uVar12 != uVar14);
        uVar12 = (ulong)uVar14;
      }
LAB_00103d7e:
      if (0 < (int)__ptr[9]) {
        lVar15 = 0;
        do {
          iVar7 = (*(int *)(*(long *)(__ptr + 4) + lVar15 * 8) - __ptr[6]) + (int)uVar12;
          *(undefined8 *)(*(long *)(__ptr + 2) + (long)iVar7 * 8) =
               *(undefined8 *)(*(long *)(__ptr + 4) + lVar15 * 8);
          if ((int)*__ptr <= iVar7) {
            *__ptr = iVar7 + 1;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < (int)__ptr[9]);
      }
      __ptr[9] = 0;
      return (acttab *)(ulong)((int)uVar12 - __ptr[6]);
    }
    iVar6 = *(int *)(lVar15 + 0x24);
  }
  if (iVar6 == 0) {
    *(int *)(lVar15 + 0x20) = iVar7;
  }
  else {
    if (*(int *)(lVar15 + 0x20) < iVar7) {
      *(int *)(lVar15 + 0x20) = iVar7;
    }
    if (*(int *)(lVar15 + 0x18) <= iVar7) goto LAB_00103b90;
  }
  *(int *)(lVar15 + 0x18) = iVar7;
  *(undefined4 *)(lVar15 + 0x1c) = extraout_EDX;
LAB_00103b90:
  lVar20 = *(long *)(lVar15 + 0x10);
  *(int *)(lVar20 + (long)iVar6 * 8) = iVar7;
  *(undefined4 *)(lVar20 + 4 + (long)iVar6 * 8) = extraout_EDX;
  *(uint *)(lVar15 + 0x24) = iVar6 + 1U;
  return (acttab *)(ulong)(iVar6 + 1U);
}

Assistant:

acttab *acttab_alloc(void){
  acttab *p = (acttab *) calloc( 1, sizeof(*p) );
  if( p==0 ){
    fprintf(stderr,"Unable to allocate memory for a new acttab.");
    exit(1);
  }
  memset(p, 0, sizeof(*p));
  return p;
}